

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

void aom_img_write(aom_image_t *img,FILE *file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *in_RSI;
  aom_image_t *in_RDI;
  int y;
  int h;
  int w;
  int stride;
  uchar *buf;
  int bytespp;
  int plane;
  int local_30;
  int local_28;
  uchar *local_20;
  int local_14;
  
  iVar2 = 1;
  if ((in_RDI->fmt & 0x800) != AOM_IMG_FMT_NONE) {
    iVar2 = 2;
  }
  local_14 = 0;
  while( true ) {
    if (2 < local_14) {
      return;
    }
    local_20 = in_RDI->planes[local_14];
    iVar1 = in_RDI->stride[local_14];
    local_28 = aom_img_plane_width(in_RDI,local_14);
    iVar3 = aom_img_plane_height(in_RDI,local_14);
    if ((in_RDI->fmt == AOM_IMG_FMT_NV12) && (1 < local_14)) break;
    if ((in_RDI->fmt == AOM_IMG_FMT_NV12) && (local_14 == 1)) {
      local_28 = local_28 << 1;
    }
    for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
      fwrite(local_20,(long)iVar2,(long)local_28,in_RSI);
      local_20 = local_20 + iVar1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void aom_img_write(const aom_image_t *img, FILE *file) {
  int plane;
  const int bytespp = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    const unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    int y;

    // Assuming that for nv12 we write all chroma data at once
    if (img->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (img->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;

    for (y = 0; y < h; ++y) {
      fwrite(buf, bytespp, w, file);
      buf += stride;
    }
  }
}